

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void __thiscall
Test_TemplateModifiers_UrlQueryEscape::Test_TemplateModifiers_UrlQueryEscape
          (Test_TemplateModifiers_UrlQueryEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  std::vector<void(*)(),std::allocator<void(*)()>>::emplace_back<void(*)()>
            ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,&local_8);
  return;
}

Assistant:

TEST(TemplateModifiers, UrlQueryEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestUrlQueryEscape", NULL);
  // The first three tests do not need escaping.
  dict.SetEscapedValue("query escape 0", "",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 1", "noop",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 2",
                       "0123456789abcdefghjijklmnopqrstuvwxyz"
                       "ABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 3", " ?a=b;c#d ",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 4", "#$%&+<=>?@[\\]^`{|}",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 5", "\xDE\xAD\xCA\xFE",
                       GOOGLE_NAMESPACE::url_query_escape);
  dict.SetEscapedValue("query escape 6", "\"':",
                       GOOGLE_NAMESPACE::url_query_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("query escape 0"), "");
  EXPECT_STREQ(peer.GetSectionValue("query escape 1"), "noop");
  EXPECT_STREQ(peer.GetSectionValue("query escape 2"),
               "0123456789abcdefghjijklmnopqrstuvwxyz"
               "ABCDEFGHIJKLMNOPQRSTUVWXYZ.-_*/~!(),");
  EXPECT_STREQ(peer.GetSectionValue("query escape 3"), "+%3Fa%3Db%3Bc%23d+");
  EXPECT_STREQ(peer.GetSectionValue("query escape 4"),
               "%23%24%25%26%2B%3C%3D%3E%3F%40%5B%5C%5D%5E%60%7B%7C%7D");
  EXPECT_STREQ(peer.GetSectionValue("query escape 5"), "%DE%AD%CA%FE");
  EXPECT_STREQ(peer.GetSectionValue("query escape 6"), "%22%27%3A");
}